

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

idx_t __thiscall duckdb::Pipeline::RegisterNewBatchIndex(Pipeline *this)

{
  idx_t iVar1;
  _Base_ptr p_Var2;
  idx_t minimum;
  idx_t local_18;
  
  ::std::mutex::lock(&this->batch_lock);
  p_Var2 = (this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1;
  if ((this->batch_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    p_Var2 = (_Base_ptr)&this->base_batch_index;
  }
  local_18 = *(idx_t *)p_Var2;
  ::std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_equal<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)&this->batch_indexes,&local_18);
  iVar1 = local_18;
  pthread_mutex_unlock((pthread_mutex_t *)&this->batch_lock);
  return iVar1;
}

Assistant:

idx_t Pipeline::RegisterNewBatchIndex() {
	lock_guard<mutex> l(batch_lock);
	idx_t minimum = batch_indexes.empty() ? base_batch_index : *batch_indexes.begin();
	batch_indexes.insert(minimum);
	return minimum;
}